

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

_Bool upb_MiniTable_NextOneofField(upb_MiniTable *m,upb_MiniTableField **f)

{
  upb_MiniTableField *puVar1;
  upb_MiniTableField *puVar2;
  upb_MiniTableField *end;
  upb_MiniTableField *ptr;
  upb_MiniTableField **f_local;
  upb_MiniTable *m_local;
  
  end = *f;
  do {
    puVar2 = end + 1;
    if (m->fields_dont_copy_me__upb_internal_use_only +
        m->field_count_dont_copy_me__upb_internal_use_only <= puVar2) {
      return false;
    }
    puVar1 = end + 1;
    end = puVar2;
  } while (puVar1->presence != (*f)->presence);
  *f = puVar2;
  return true;
}

Assistant:

bool upb_MiniTable_NextOneofField(const upb_MiniTable* m,
                                  const upb_MiniTableField** f) {
  const upb_MiniTableField* ptr = *f;
  const upb_MiniTableField* end =
      &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
  while (++ptr < end) {
    if (ptr->presence == (*f)->presence) {
      *f = ptr;
      return true;
    }
  }
  return false;
}